

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_unsigned.cpp
# Opt level: O3

bool sc_dt::operator<(sc_unsigned *u,long v)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  uint vs;
  sc_digit vd [3];
  
  uVar2 = 0;
  if (v < 0) goto LAB_001e9199;
  uVar3 = 0;
  if (v == 0) {
LAB_001e9148:
    vs = uVar2;
    memset(vd + (uVar3 & 0xffffffff),0,(ulong)(2 - (int)uVar3) * 4 + 4);
  }
  else {
    uVar3 = 0;
    do {
      uVar4 = uVar3;
      uVar3 = uVar4 + 1;
      vd[uVar4] = (uint)v & 0x3fffffff;
      if (1 < uVar4) break;
      bVar1 = 0x3fffffff < (ulong)v;
      v = (ulong)v >> 0x1e;
    } while (bVar1);
    vs = 1;
    uVar2 = 1;
    if (uVar4 < 2) goto LAB_001e9148;
  }
  uVar2 = compare_unsigned(u->sgn,u->nbits,u->ndigits,u->digit,vs,0x40,3,vd,0,0);
  uVar2 = uVar2 >> 0x1f;
LAB_001e9199:
  return SUB41(uVar2,0);
}

Assistant:

bool
operator<(const sc_unsigned& u, long v)
{
  if (v < 0)
    return false;
  CONVERT_LONG(v);
  if (compare_unsigned(u.sgn, u.nbits, u.ndigits, u.digit,
                       vs, BITS_PER_ULONG, DIGITS_PER_ULONG, vd) < 0)
    return true;
  return false;
}